

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::SyncToSetAndBackupInst<false>::Exec
          (SyncToSetAndBackupInst<false> *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  CharCount CVar5;
  
  uVar2 = (this->super_BackupMixin).backup.lower;
  CVar5 = *matchStart;
  if (inputLength - CVar5 < uVar2) {
    *matchStart = inputLength;
LAB_00d48007:
    bVar3 = true;
  }
  else {
    uVar4 = *inputOffset;
    if (uVar4 < *nextSyncInputOffset) {
      *instPointer = *instPointer + 0x31;
    }
    else {
      if (uVar4 - CVar5 < uVar2) {
        uVar4 = CVar5 + uVar2;
        *inputOffset = uVar4;
      }
      while (uVar4 < inputLength) {
        bVar3 = RuntimeCharSet<char16_t>::Get(&(this->super_SetMixin<false>).set,input[uVar4]);
        if (bVar3) {
          uVar4 = *inputOffset;
          break;
        }
        if (matcher->stats != (Type)0x0) {
          puVar1 = &matcher->stats->numCompares;
          *puVar1 = *puVar1 + 1;
        }
        uVar4 = *inputOffset + 1;
        *inputOffset = uVar4;
      }
      if (inputLength <= uVar4) {
        *matchStart = inputLength;
        goto LAB_00d48007;
      }
      *nextSyncInputOffset = uVar4 + 1;
      uVar2 = (this->super_BackupMixin).backup.upper;
      CVar5 = *matchStart;
      if (uVar2 != 0xffffffff) {
        uVar4 = *inputOffset - CVar5;
        if (uVar2 <= uVar4) {
          uVar4 = uVar2;
        }
        CVar5 = *inputOffset - uVar4;
        *matchStart = CVar5;
      }
      *inputOffset = CVar5;
      *instPointer = *instPointer + 0x31;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

inline bool SyncToSetAndBackupInst<IsNegation>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (backup.lower > inputLength - matchStart)
        {
            // Even match at very end doesn't allow for minimum backup
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        if (inputOffset < nextSyncInputOffset)
        {
            // We have not yet reached the offset in the input we last synced to before backing up, so it's unnecessary to sync
            // again since we'll sync to the same point in the input and back up to the same place we are at now
            instPointer += sizeof(*this);
            return false;
        }

        if (backup.lower > inputOffset - matchStart)
        {
            // No use looking for match until minimum backup is possible
            inputOffset = matchStart + backup.lower;
        }

        const RuntimeCharSet<Char>& matchSet = this->set;
        while (inputOffset < inputLength && matchSet.Get(input[inputOffset]) == IsNegation)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        if (inputOffset >= inputLength)
        {
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        nextSyncInputOffset = inputOffset + 1;

        if (backup.upper != CharCountFlag)
        {
            // Backup at most by backup.upper for new start
            CharCount maxBackup = inputOffset - matchStart;
            matchStart = inputOffset - min(maxBackup, (CharCount)backup.upper);
        }
        // else: leave start where it is

        // Move input to new match start
        inputOffset = matchStart;
        instPointer += sizeof(*this);
        return false;
    }